

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Core.c
# Opt level: O1

int Llb_ManModelCheckAig
              (Aig_Man_t *pAigGlo,Gia_ParLlb_t *pPars,Vec_Int_t *vHints,DdManager **pddGlo)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAig;
  Llb_Man_t *p;
  long lVar3;
  int level;
  long lVar4;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (pPars->fIndConstr != 0) {
    if (vHints != (Vec_Int_t *)0x0) {
      __assert_fail("vHints == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Core.c"
                    ,0x79,
                    "int Llb_ManModelCheckAig(Aig_Man_t *, Gia_ParLlb_t *, Vec_Int_t *, DdManager **)"
                   );
    }
    vHints = Llb_ManDeriveConstraints(pAigGlo);
  }
  if (vHints == (Vec_Int_t *)0x0) {
    pAig = Aig_ManDupSimple(pAigGlo);
  }
  else {
    if (pPars->fVerbose != 0) {
      Llb_ManPrintEntries(pAigGlo,vHints);
    }
    pAig = Aig_ManDupSimpleWithHints(pAigGlo,vHints);
  }
  p = Llb_ManStart(pAigGlo,pAig,pPars);
  if (pPars->fVerbose != 0) {
    Llb_ManPrintAig(p);
    printf("Original matrix:          ");
    Llb_MtrPrintMatrixStats(p->pMatrix);
    if (pPars->fVeryVerbose != 0) {
      Llb_MtrPrint(p->pMatrix,1);
    }
  }
  if (pPars->fCluster != 0) {
    Llb_ManCluster(p->pMatrix);
    if (pPars->fVerbose != 0) {
      printf("Matrix after clustering:  ");
      Llb_MtrPrintMatrixStats(p->pMatrix);
      if (pPars->fVeryVerbose != 0) {
        Llb_MtrPrint(p->pMatrix,1);
      }
    }
  }
  if (pPars->fSchedule != 0) {
    Llb_MtrSchedule(p->pMatrix);
    if (pPars->fVerbose != 0) {
      printf("Matrix after scheduling:  ");
      Llb_MtrPrintMatrixStats(p->pMatrix);
      if (pPars->fVeryVerbose != 0) {
        Llb_MtrPrint(p->pMatrix,1);
      }
    }
  }
  iVar1 = -1;
  if (p->pPars->fSkipReach == 0) {
    iVar1 = Llb_ManReachability(p,vHints,pddGlo);
  }
  Llb_ManStop(p);
  level = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  if ((vHints != (Vec_Int_t *)0x0) && (pPars->fIndConstr != 0)) {
    if (vHints->pArray != (int *)0x0) {
      free(vHints->pArray);
      vHints->pArray = (int *)0x0;
    }
    free(vHints);
  }
  return iVar1;
}

Assistant:

int Llb_ManModelCheckAig( Aig_Man_t * pAigGlo, Gia_ParLlb_t * pPars, Vec_Int_t * vHints, DdManager ** pddGlo )
{
    Llb_Man_t * p = NULL; 
    Aig_Man_t * pAig;
    int RetValue = -1;
    abctime clk = Abc_Clock();

    if ( pPars->fIndConstr )
    {
        assert( vHints == NULL );
        vHints = Llb_ManDeriveConstraints( pAigGlo );
    }

    // derive AIG for hints
    if ( vHints == NULL )
        pAig = Aig_ManDupSimple( pAigGlo );
    else
    {
        if ( pPars->fVerbose )
            Llb_ManPrintEntries( pAigGlo, vHints );
        pAig = Aig_ManDupSimpleWithHints( pAigGlo, vHints );
    }


    if ( pPars->fUseFlow )
    {
//        p = Llb_ManStartFlow( pAigGlo, pAig, pPars );
    }
    else
    {
        p = Llb_ManStart( pAigGlo, pAig, pPars );
        if ( pPars->fVerbose )
        {
            Llb_ManPrintAig( p );
            printf( "Original matrix:          " );
            Llb_MtrPrintMatrixStats( p->pMatrix );
            if ( pPars->fVeryVerbose )
                Llb_MtrPrint( p->pMatrix, 1 );
        }
        if ( pPars->fCluster )
        {
            Llb_ManCluster( p->pMatrix );
            if ( pPars->fVerbose )
            {
                printf( "Matrix after clustering:  " );
                Llb_MtrPrintMatrixStats( p->pMatrix );
                if ( pPars->fVeryVerbose )
                    Llb_MtrPrint( p->pMatrix, 1 );
            }
        }
        if ( pPars->fSchedule )
        {
            Llb_MtrSchedule( p->pMatrix );
            if ( pPars->fVerbose )
            {
                printf( "Matrix after scheduling:  " );
                Llb_MtrPrintMatrixStats( p->pMatrix );
                if ( pPars->fVeryVerbose )
                    Llb_MtrPrint( p->pMatrix, 1 );
            }
        }
    }
    
    if ( !p->pPars->fSkipReach ) 
        RetValue = Llb_ManReachability( p, vHints, pddGlo );
    Llb_ManStop( p );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( pPars->fIndConstr )
        Vec_IntFreeP( &vHints );
    return RetValue;
}